

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase252::run(TestCase252 *this)

{
  PointerBuilder builder;
  Reader reader;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Orphanage OVar5;
  ArrayPtr<const_unsigned_int> value;
  initializer_list<unsigned_int> expected;
  Builder root2;
  Builder root1;
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder1;
  PointerReader local_318;
  StructBuilder local_2f8;
  int local_2d0;
  OrphanBuilder local_2c0;
  Builder local_2a0;
  StructBuilder local_288;
  ListReader local_258;
  ListReader local_228;
  MallocMessageBuilder local_1f8;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MallocMessageBuilder::MallocMessageBuilder(&local_1f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_318,&local_108.super_MessageBuilder);
  local_2f8.data = local_318.pointer;
  local_2f8.segment = (SegmentBuilder *)local_318.segment;
  local_2f8.capTable = (CapTableBuilder *)local_318.capTable;
  PointerBuilder::initStruct(&local_288,(PointerBuilder *)&local_2f8,(StructSize)0x140006);
  local_318.segment = (SegmentReader *)0x220000000c;
  local_318.capTable = (CapTableReader *)CONCAT44(local_318.capTable._4_4_,0x38);
  local_2f8.data = local_288.pointers + 0xb;
  local_2f8.segment = local_288.segment;
  local_2f8.capTable = local_288.capTable;
  builder.capTable = local_288.capTable;
  builder.segment = local_288.segment;
  builder.pointer = (WirePointer *)local_2f8.data;
  value.size_ = 3;
  value.ptr = (uint *)&local_318;
  PointerHelpers<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder,value);
  OVar5 = MessageBuilder::getOrphanage(&local_1f8.super_MessageBuilder);
  StructBuilder::asReader(&local_288);
  local_318.pointer = local_2f8.pointers + 0xb;
  if (local_2f8.pointerCount < 0xc) {
    local_318.pointer = (WirePointer *)0x0;
  }
  if (local_2f8.pointerCount < 0xc) {
    uVar1 = 0;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    local_2d0 = 0x7fffffff;
  }
  else {
    uVar1 = local_2f8.segment._0_4_;
    uVar2 = local_2f8.segment._4_4_;
    uVar3 = local_2f8.capTable._0_4_;
    uVar4 = local_2f8.capTable._4_4_;
  }
  local_318.segment = (SegmentReader *)CONCAT44(uVar2,uVar1);
  local_318.capTable = (CapTableReader *)CONCAT44(uVar4,uVar3);
  local_318.nestingLimit = local_2d0;
  PointerReader::getList(&local_228,&local_318,FOUR_BYTES,(word *)0x0);
  OrphanBuilder::copy((OrphanBuilder *)&local_318,(EVP_PKEY_CTX *)OVar5.arena,
                      (EVP_PKEY_CTX *)OVar5.capTable);
  local_2c0.segment = (SegmentBuilder *)local_318.capTable;
  local_2c0.capTable = (CapTableBuilder *)local_318.pointer;
  local_2c0.location = (word *)CONCAT44(local_318._28_4_,local_318.nestingLimit);
  local_2c0.tag.content = (uint64_t)local_318.segment;
  OrphanBuilder::asListReader(&local_258,&local_2c0,FOUR_BYTES);
  local_2f8.segment = (SegmentBuilder *)0x220000000c;
  local_2f8.capTable = (CapTableBuilder *)CONCAT44(local_2f8.capTable._4_4_,0x38);
  reader.reader.capTable = local_258.capTable;
  reader.reader.segment = local_258.segment;
  reader.reader.ptr = local_258.ptr;
  reader.reader.elementCount = local_258.elementCount;
  reader.reader.step = local_258.step;
  reader.reader.structDataSize = local_258.structDataSize;
  reader.reader.structPointerCount = local_258.structPointerCount;
  reader.reader.elementSize = local_258.elementSize;
  reader.reader._39_1_ = local_258._39_1_;
  reader.reader.nestingLimit = local_258.nestingLimit;
  reader.reader._44_4_ = local_258._44_4_;
  expected._M_len = 3;
  expected._M_array = (iterator)&local_2f8;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader,expected);
  MessageBuilder::getRootInternal(&local_2a0,&local_1f8.super_MessageBuilder);
  local_318.pointer = local_2a0.builder.pointer;
  local_318.segment = &(local_2a0.builder.segment)->super_SegmentReader;
  local_318.capTable = &(local_2a0.builder.capTable)->super_CapTableReader;
  PointerBuilder::initStruct(&local_2f8,(PointerBuilder *)&local_318,(StructSize)0x140006);
  local_318.pointer = local_2f8.pointers + 0xb;
  local_318.segment = &(local_2f8.segment)->super_SegmentReader;
  local_318.capTable = &(local_2f8.capTable)->super_CapTableReader;
  PointerBuilder::adopt((PointerBuilder *)&local_318,&local_2c0);
  if (local_2c0.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_2c0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_1f8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(Orphans, OrphanageListCopy) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;

  auto root1 = builder1.initRoot<TestAllTypes>();
  root1.setUInt32List({12, 34, 56});

  Orphan<List<uint32_t>> orphan = builder2.getOrphanage().newOrphanCopy(
      root1.asReader().getUInt32List());
  checkList(orphan.getReader(), {12u, 34u, 56u});

  auto root2 = builder2.initRoot<TestAllTypes>();
  root2.adoptUInt32List(kj::mv(orphan));
}